

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp.cpp
# Opt level: O0

void mg::data::mzp_write(Mzp *mzp,string *out)

{
  MzpArchiveHeader MVar1;
  uint32_t size;
  uint32_t offset;
  size_type sVar2;
  undefined8 *puVar3;
  reference pvVar4;
  value_type *pvVar5;
  void *__dest;
  void *__src;
  size_t __n;
  value_type *entry_data_1;
  size_type header_output_offset;
  value_type *entry_header_1;
  uint i_1;
  size_type output_size;
  size_type entry_size;
  value_type *entry_data;
  MzpArchiveEntry *entry_header;
  uint i;
  size_type current_data_offset;
  vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  entry_headers;
  size_type data_segment_start;
  MzpArchiveHeader header;
  string *out_local;
  Mzp *mzp_local;
  
  header = (MzpArchiveHeader)out;
  std::__cxx11::string::clear();
  data_segment_start._0_4_ = 0x6467726d;
  data_segment_start._4_2_ = 0x3030;
  sVar2 = std::
          vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
          size(&mzp->entry_headers);
  data_segment_start._6_2_ = (undefined2)sVar2;
  Mzp::MzpArchiveHeader::to_file_order((MzpArchiveHeader *)&data_segment_start);
  std::__cxx11::string::resize((ulong)header);
  puVar3 = (undefined8 *)std::__cxx11::string::operator[]((ulong)header);
  *puVar3 = CONCAT26(data_segment_start._6_2_,
                     CONCAT24(data_segment_start._4_2_,(undefined4)data_segment_start));
  sVar2 = std::
          vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
          size(&mzp->entry_headers);
  entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(sVar2 * 8 + 8);
  std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
  vector((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_> *)
         &current_data_offset,&mzp->entry_headers);
  offset = 0;
  entry_header._4_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
            ::size(&mzp->entry_headers);
    if (sVar2 <= entry_header._4_4_) break;
    pvVar4 = std::
             vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
             ::operator[]((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                           *)&current_data_offset,(ulong)entry_header._4_4_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&mzp->entry_data,(ulong)entry_header._4_4_);
    size = std::__cxx11::string::size();
    Mzp::MzpArchiveEntry::set_offsets(pvVar4,offset);
    Mzp::MzpArchiveEntry::set_data_size(pvVar4,size);
    offset = size + offset;
    entry_header._4_4_ = entry_header._4_4_ + 1;
  }
  std::__cxx11::string::resize
            ((ulong)header,
             (char)entry_headers.
                   super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + (char)offset);
  entry_header_1._0_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
            ::size(&mzp->entry_headers);
    if (sVar2 <= (uint)entry_header_1) break;
    pvVar4 = std::
             vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
             ::operator[]((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                           *)&current_data_offset,(ulong)(uint)entry_header_1);
    Mzp::MzpArchiveEntry::to_file_order(pvVar4);
    pvVar5 = (value_type *)std::__cxx11::string::operator[]((ulong)header);
    *pvVar5 = *pvVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&mzp->entry_data,(ulong)(uint)entry_header_1);
    MVar1 = header;
    Mzp::MzpArchiveEntry::data_offset_relative(pvVar4);
    __dest = (void *)std::__cxx11::string::operator[]((ulong)MVar1);
    __src = (void *)std::__cxx11::string::data();
    __n = std::__cxx11::string::size();
    memcpy(__dest,__src,__n);
    entry_header_1._0_4_ = (uint)entry_header_1 + 1;
  }
  std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
  ~vector((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_> *
          )&current_data_offset);
  return;
}

Assistant:

void mzp_write(const Mzp &mzp, std::string &out) {
  // Clear output
  out.clear();

  // Write header
  Mzp::MzpArchiveHeader header;
  memcpy(header.magic, Mzp::FILE_MAGIC, sizeof(Mzp::MzpArchiveHeader::magic));
  header.archive_entry_count = mzp.entry_headers.size();
  header.to_file_order();
  out.resize(sizeof(header));
  memcpy(&out[0], &header, sizeof(header));

  // Calculate the data segment start
  std::string::size_type data_segment_start =
      sizeof(Mzp::MzpArchiveHeader) +
      sizeof(Mzp::MzpArchiveEntry) * mzp.entry_headers.size();

  // Clone the header data so that we can recalculate it
  std::vector<Mzp::MzpArchiveEntry> entry_headers = mzp.entry_headers;
  std::string::size_type current_data_offset = 0;
  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    Mzp::MzpArchiveEntry &entry_header = entry_headers[i];
    auto &entry_data = mzp.entry_data[i];
    const std::string::size_type entry_size = entry_data.size();
    entry_header.set_offsets(current_data_offset);
    entry_header.set_data_size(entry_size);
    current_data_offset += entry_size;
    // Pad current data offset to 16 byte boundary
    // const std::string::size_type real_data_end_addr =
    //     data_segment_start + current_data_offset;
    // current_data_offset += 16 - (real_data_end_addr % 16);
  }

  // Calculate total file size
  const std::string::size_type output_size =
      data_segment_start + current_data_offset;
  out.resize(output_size, 0xFF);

  // Write out each datum pair, since we need to use the header to get the
  // correct data offset
  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    // Convert header to file order and emit
    auto &entry_header = entry_headers[i];
    entry_header.to_file_order();
    const std::string::size_type header_output_offset =
        sizeof(Mzp::MzpArchiveHeader) + sizeof(Mzp::MzpArchiveEntry) * i;
    memcpy(&out[header_output_offset], &entry_header, sizeof(entry_header));

    // Insert data at data start + data offset
    auto &entry_data = mzp.entry_data[i];
    memcpy(&out[data_segment_start + entry_header.data_offset_relative()],
           entry_data.data(), entry_data.size());
  }
}